

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall absl::lts_20250127::Condition::Condition(Condition *this,bool *cond)

{
  char *local_28;
  FunctionPointer dereference;
  bool *cond_local;
  Condition *this_local;
  
  this->callback_[0] = '\0';
  local_28 = this->callback_ + 1;
  do {
    *local_28 = '\0';
    local_28 = local_28 + 1;
  } while ((_func_bool_Condition_ptr **)local_28 != &this->eval_);
  this->eval_ = CallVoidPtrFunction;
  this->arg_ = cond;
  StoreCallback<bool(*)(void*)>(this,Dereference);
  return;
}

Assistant:

Condition::Condition(const bool* cond)
    : eval_(CallVoidPtrFunction),
      // const_cast is safe since Dereference does not modify arg
      arg_(const_cast<bool*>(cond)) {
  using FunctionPointer = bool (*)(void*);
  const FunctionPointer dereference = Dereference;
  StoreCallback(dereference);
}